

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

ssize_t __thiscall
booster::aio::stream_socket::writev(stream_socket *this,int __fd,iovec *__iovec,int __count)

{
  native_type __fd_00;
  ulong uVar1;
  int *piVar2;
  bool bVar3;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar4;
  int ret;
  iovec vec [16];
  uint size;
  buffer_data_type data;
  undefined8 local_138;
  buffer_impl<const_char_*> *in_stack_fffffffffffffed0;
  uint local_2c;
  entry *local_28;
  ulong local_20;
  
  pVar4 = buffer_impl<const_char_*>::get(in_stack_fffffffffffffed0);
  local_2c = 0;
  while( true ) {
    bVar3 = false;
    if (local_2c < 0x10) {
      local_20 = pVar4.second;
      bVar3 = local_2c < local_20;
    }
    if (!bVar3) break;
    local_28 = pVar4.first;
    (&local_138)[(ulong)local_2c * 2] = local_28[local_2c].ptr;
    *(size_t *)(&stack0xfffffffffffffed0 + (ulong)local_2c * 0x10) = local_28[local_2c].size;
    local_2c = local_2c + 1;
  }
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    uVar1 = ::writev(__fd_00,(iovec *)&local_138,local_2c);
    if ((-1 < (int)uVar1) || (-1 < (int)uVar1)) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return uVar1 & 0xffffffff;
}

Assistant:

int stream_socket::writev(const_buffer const &b)
{
	static const unsigned max_vec_size = 16;
	const_buffer::buffer_data_type data = b.get();
	unsigned size=0;
#ifndef BOOSTER_WIN32
	struct iovec vec[max_vec_size];
	for(;size < max_vec_size && size < data.second;size++) {
		vec[size].iov_base = const_cast<char *>(data.first[size].ptr);
		vec[size].iov_len = data.first[size].size;
	}
	for(;;) {
		int ret = ::writev(native(),vec,size);
		if(ret >= 0)
			return ret;
		if(ret < 0 && errno==EINTR)
			continue;
		return ret;
	}
#else // Win32
	WSABUF vec[max_vec_size];
	for(;size < max_vec_size && size < data.second;size++) {
		vec[size].buf = const_cast<char *>(data.first[size].ptr);
		vec[size].len = data.first[size].size;
	}
	DWORD send=0;
	int res = ::WSASend(native(),vec,size,&send,0,0,0);
	if(res == 0)
		return send;
	return -1;
#endif
}